

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  long *plVar3;
  TestError *this_00;
  size_type *psVar4;
  string shader_code_common_part;
  string iteration_specific_shader_code_part;
  string shader_source;
  string y_variable_initializaton;
  string x_variable_initializaton;
  string variable_initialiser;
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  ulong local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  variable_initialiser._M_dataplus._M_p = (pointer)&variable_initialiser.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&variable_initialiser,
             "    float[](float[](float(float(float(float(float(float(1.0))))))));\n","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"float","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"1.0","");
  recursively_initialise(&shader_code_common_part,this,&local_50,8,&local_70);
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)&shader_code_common_part,0,(char *)0x0,0x1ad08b8);
  paVar1 = &y_variable_initializaton.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    y_variable_initializaton.field_2._M_allocated_capacity = *psVar4;
    y_variable_initializaton.field_2._8_8_ = plVar3[3];
    y_variable_initializaton._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    y_variable_initializaton.field_2._M_allocated_capacity = *psVar4;
    y_variable_initializaton._M_dataplus._M_p = (pointer)*plVar3;
  }
  y_variable_initializaton._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&y_variable_initializaton);
  x_variable_initializaton._M_dataplus._M_p = (pointer)&x_variable_initializaton.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    x_variable_initializaton.field_2._M_allocated_capacity = *psVar4;
    x_variable_initializaton.field_2._8_8_ = plVar3[3];
  }
  else {
    x_variable_initializaton.field_2._M_allocated_capacity = *psVar4;
    x_variable_initializaton._M_dataplus._M_p = (pointer)*plVar3;
  }
  x_variable_initializaton._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)y_variable_initializaton._M_dataplus._M_p != paVar1) {
    operator_delete(y_variable_initializaton._M_dataplus._M_p,
                    y_variable_initializaton.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_code_common_part._M_dataplus._M_p != &shader_code_common_part.field_2) {
    operator_delete(shader_code_common_part._M_dataplus._M_p,
                    shader_code_common_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"float","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"1.0","");
  recursively_initialise(&iteration_specific_shader_code_part,this,&local_90,8,&local_b0);
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)&iteration_specific_shader_code_part,0,(char *)0x0,0x1ad08df);
  shader_code_common_part._M_dataplus._M_p = (pointer)&shader_code_common_part.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    shader_code_common_part.field_2._M_allocated_capacity = *psVar4;
    shader_code_common_part.field_2._8_8_ = plVar3[3];
  }
  else {
    shader_code_common_part.field_2._M_allocated_capacity = *psVar4;
    shader_code_common_part._M_dataplus._M_p = (pointer)*plVar3;
  }
  shader_code_common_part._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&shader_code_common_part);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    y_variable_initializaton.field_2._M_allocated_capacity = *psVar4;
    y_variable_initializaton.field_2._8_8_ = plVar3[3];
    y_variable_initializaton._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    y_variable_initializaton.field_2._M_allocated_capacity = *psVar4;
    y_variable_initializaton._M_dataplus._M_p = (pointer)*plVar3;
  }
  y_variable_initializaton._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_code_common_part._M_dataplus._M_p != &shader_code_common_part.field_2) {
    operator_delete(shader_code_common_part._M_dataplus._M_p,
                    shader_code_common_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iteration_specific_shader_code_part._M_dataplus._M_p !=
      &iteration_specific_shader_code_part.field_2) {
    operator_delete(iteration_specific_shader_code_part._M_dataplus._M_p,
                    CONCAT71(iteration_specific_shader_code_part.field_2._M_allocated_capacity._1_7_
                             ,iteration_specific_shader_code_part.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&iteration_specific_shader_code_part,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shader_start_abi_cxx11_,&x_variable_initializaton);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&iteration_specific_shader_code_part,
                              (ulong)y_variable_initializaton._M_dataplus._M_p);
  shader_code_common_part._M_dataplus._M_p = (pointer)&shader_code_common_part.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    shader_code_common_part.field_2._M_allocated_capacity = *psVar4;
    shader_code_common_part.field_2._8_8_ = plVar3[3];
  }
  else {
    shader_code_common_part.field_2._M_allocated_capacity = *psVar4;
    shader_code_common_part._M_dataplus._M_p = (pointer)*plVar3;
  }
  shader_code_common_part._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iteration_specific_shader_code_part._M_dataplus._M_p !=
      &iteration_specific_shader_code_part.field_2) {
    operator_delete(iteration_specific_shader_code_part._M_dataplus._M_p,
                    CONCAT71(iteration_specific_shader_code_part.field_2._M_allocated_capacity._1_7_
                             ,iteration_specific_shader_code_part.field_2._M_local_buf[0]) + 1);
  }
  local_b8 = (ulong)tested_shader_type;
  iteration_specific_shader_code_part._M_dataplus._M_p =
       (pointer)&iteration_specific_shader_code_part.field_2;
  iteration_specific_shader_code_part._M_string_length = 0;
  iteration_specific_shader_code_part.field_2._M_local_buf[0] = '\0';
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"    x","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"[0]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_138,(string *)local_d8,1);
  std::__cxx11::string::_M_append
            ((char *)&iteration_specific_shader_code_part,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  uVar2 = local_b8;
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  std::__cxx11::string::append((char *)&iteration_specific_shader_code_part);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"y","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"[0]","");
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,(string *)local_f8,(string *)local_118,1);
  std::__cxx11::string::_M_append
            ((char *)&iteration_specific_shader_code_part,(ulong)shader_source._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  std::__cxx11::string::append((char *)&iteration_specific_shader_code_part);
  std::operator+(&shader_source,&shader_code_common_part,&iteration_specific_shader_code_part);
  if (tested_shader_type < SHADER_TYPE_LAST) {
    (*(code *)(&DAT_01aca774 + *(int *)(&DAT_01aca774 + uVar2 * 4)))();
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xcd6);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsIndexingArray2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string variable_initialiser = "    float[](float[](float(float(float(float(float(float(1.0))))))));\n";

	std::string x_variable_initializaton =
		"    float x[2][2][2][2][2][2][2][1] = " + recursively_initialise("float", API::MAX_ARRAY_DIMENSIONS, "1.0") +
		";\n";
	std::string y_variable_initializaton =
		"    float y[2][2][2][2][2][2][2][1] = " + recursively_initialise("float", API::MAX_ARRAY_DIMENSIONS, "1.0") +
		";\n";

	std::string shader_code_common_part = shader_start + x_variable_initializaton + y_variable_initializaton;

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string iteration_specific_shader_code_part;

		iteration_specific_shader_code_part += this->extend_string("    x", "[0]", max_dimension_index);
		iteration_specific_shader_code_part += " = ";
		iteration_specific_shader_code_part += this->extend_string("y", "[0]", max_dimension_index);
		iteration_specific_shader_code_part += ";\n";

		std::string shader_source = shader_code_common_part + iteration_specific_shader_code_part;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	}
}